

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticlePairs.test.cpp
# Opt level: O1

string * invalidSize_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 0.000000+0 0.000000+0          2          1         23          4262532151     \n 0.000000+0 5.446635+1 0.000000+0 2.600000+1 1.000000+0 0.000000+0262532151     \n 0.000000+0 0.000000+0 0.000000+0 1.020000+2 0.000000+0 0.000000+0262532151     \n 1.000000+0 5.347624+1 0.000000+0 2.600000+1 5.000000-1 0.000000+0262532151     \n 0.000000+0 1.000000+0 0.000000+0 2.000000+0 0.000000+0           262532151     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string invalidSize() {
  return
  " 0.000000+0 0.000000+0          2          1         23          4262532151     \n"
  " 0.000000+0 5.446635+1 0.000000+0 2.600000+1 1.000000+0 0.000000+0262532151     \n"
  " 0.000000+0 0.000000+0 0.000000+0 1.020000+2 0.000000+0 0.000000+0262532151     \n"
  " 1.000000+0 5.347624+1 0.000000+0 2.600000+1 5.000000-1 0.000000+0262532151     \n"
  " 0.000000+0 1.000000+0 0.000000+0 2.000000+0 0.000000+0           262532151     \n";
}